

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqComms.cpp
# Opt level: O2

void __thiscall helics::zeromq::ZmqComms::loadNetworkInfo(ZmqComms *this,NetworkBrokerData *netInfo)

{
  string *networkAddress;
  string *networkAddress_00;
  bool bVar1;
  char *pcVar2;
  
  NetworkCommsInterface::loadNetworkInfo(&this->super_NetworkCommsInterface,netInfo);
  bVar1 = CommsInterface::propertyLock((CommsInterface *)this);
  if (!bVar1) {
    return;
  }
  networkAddress = &(this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress;
  if ((this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress._M_string_length
      != 0) {
    gmlc::networking::insertProtocol(networkAddress,TCP);
  }
  networkAddress_00 = &(this->super_NetworkCommsInterface).super_CommsInterface.localTargetAddress;
  if ((this->super_NetworkCommsInterface).super_CommsInterface.localTargetAddress._M_string_length
      != 0) {
    gmlc::networking::insertProtocol(networkAddress_00,TCP);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          networkAddress_00,"tcp://localhost");
  if (bVar1) {
    pcVar2 = "tcp://127.0.0.1";
LAB_002231d7:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               networkAddress_00,pcVar2);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            networkAddress_00,"udp://localhost");
    if (bVar1) {
      pcVar2 = "udp://127.0.0.1";
      goto LAB_002231d7;
    }
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          networkAddress,"tcp://localhost");
  if (bVar1) {
    pcVar2 = "tcp://127.0.0.1";
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            networkAddress,"udp://localhost");
    if (!bVar1) goto LAB_0022321d;
    pcVar2 = "udp://127.0.0.1";
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)networkAddress,
             pcVar2);
LAB_0022321d:
  CommsInterface::propertyUnLock((CommsInterface *)this);
  return;
}

Assistant:

void ZmqComms::loadNetworkInfo(const NetworkBrokerData& netInfo)
{
    NetworkCommsInterface::loadNetworkInfo(netInfo);
    if (!propertyLock()) {
        return;
    }
    if (!brokerTargetAddress.empty()) {
        gmlc::networking::insertProtocol(brokerTargetAddress,
                                         gmlc::networking::InterfaceTypes::TCP);
    }
    if (!localTargetAddress.empty()) {
        gmlc::networking::insertProtocol(localTargetAddress, gmlc::networking::InterfaceTypes::TCP);
    }
    if (localTargetAddress == "tcp://localhost") {
        localTargetAddress = "tcp://127.0.0.1";
    } else if (localTargetAddress == "udp://localhost") {
        localTargetAddress = "udp://127.0.0.1";
    }
    if (brokerTargetAddress == "tcp://localhost") {
        brokerTargetAddress = "tcp://127.0.0.1";
    } else if (brokerTargetAddress == "udp://localhost") {
        brokerTargetAddress = "udp://127.0.0.1";
    }
    propertyUnLock();
}